

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ForLoopStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForLoopStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>&,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          SeparatedSyntaxList<slang::syntax::SyntaxNode> *args_4,Token *args_5,
          ExpressionSyntax **args_6,Token *args_7,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_8,Token *args_9,
          StatementSyntax *args_10)

{
  Token forKeyword;
  Token openParen;
  Token semi1;
  Token semi2;
  Token closeParen;
  ForLoopStatementSyntax *this_00;
  
  this_00 = (ForLoopStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ForLoopStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ForLoopStatementSyntax *)allocateSlow(this,0x128,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  forKeyword.kind = args_2->kind;
  forKeyword._2_1_ = args_2->field_0x2;
  forKeyword.numFlags.raw = (args_2->numFlags).raw;
  forKeyword.rawLen = args_2->rawLen;
  forKeyword.info = args_2->info;
  closeParen.kind = args_9->kind;
  closeParen._2_1_ = args_9->field_0x2;
  closeParen.numFlags.raw = (args_9->numFlags).raw;
  closeParen.rawLen = args_9->rawLen;
  closeParen.info = args_9->info;
  semi2.kind = args_7->kind;
  semi2._2_1_ = args_7->field_0x2;
  semi2.numFlags.raw = (args_7->numFlags).raw;
  semi2.rawLen = args_7->rawLen;
  semi2.info = args_7->info;
  semi1.kind = args_5->kind;
  semi1._2_1_ = args_5->field_0x2;
  semi1.numFlags.raw = (args_5->numFlags).raw;
  semi1.rawLen = args_5->rawLen;
  semi1.info = args_5->info;
  openParen.kind = args_3->kind;
  openParen._2_1_ = args_3->field_0x2;
  openParen.numFlags.raw = (args_3->numFlags).raw;
  openParen.rawLen = args_3->rawLen;
  openParen.info = args_3->info;
  slang::syntax::ForLoopStatementSyntax::ForLoopStatementSyntax
            (this_00,*args,args_1,forKeyword,openParen,args_4,semi1,*args_6,semi2,args_8,closeParen,
             args_10);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }